

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O2

void __thiscall acto::core::runtime_t::~runtime_t(runtime_t *this)

{
  void *in_RSI;
  
  (this->super_callbacks)._vptr_callbacks = (_func_int **)&PTR__runtime_t_0010fcc8;
  LOCK();
  (this->terminating_)._M_base._M_i = true;
  UNLOCK();
  event::signaled(&this->queue_event_);
  event::wait(&this->no_workers_event_,in_RSI);
  LOCK();
  (this->active_)._M_base._M_i = false;
  UNLOCK();
  event::signaled(&this->queue_event_);
  if ((this->m_scheduler)._M_id._M_thread != 0) {
    std::thread::join();
  }
  if (((this->workers_).count.super___atomic_base<unsigned_long>._M_i == 0) &&
     ((this->workers_).reserved.super___atomic_base<unsigned_long>._M_i == 0)) {
    std::thread::~thread(&this->m_scheduler);
    std::
    _Hashtable<acto::core::object_t_*,_acto::core::object_t_*,_std::allocator<acto::core::object_t_*>,_std::__detail::_Identity,_std::equal_to<acto::core::object_t_*>,_std::hash<acto::core::object_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&(this->actors_)._M_h);
    std::condition_variable::~condition_variable(&(this->no_workers_event_).cond_);
    std::condition_variable::~condition_variable(&(this->idle_workers_event_).cond_);
    std::condition_variable::~condition_variable(&(this->queue_event_).cond_);
    std::condition_variable::~condition_variable(&(this->no_actors_event_).cond_);
    return;
  }
  __assert_fail("workers_.count == 0 && workers_.reserved == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/artpaul[P]acto/src/runtime.cpp"
                ,0x6a,"virtual acto::core::runtime_t::~runtime_t()");
}

Assistant:

runtime_t::~runtime_t() {
  terminating_ = true;
  // Дождаться, когда все потоки будут удалены
  queue_event_.signaled();
  no_workers_event_.wait();

  active_ = false;

  queue_event_.signaled();
  // Stop scheduler's thread.
  if (m_scheduler.joinable()) {
    m_scheduler.join();
  }

  assert(workers_.count == 0 && workers_.reserved == 0);
}